

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall
Catch::Runner2::runTestsForGroup
          (Totals *__return_storage_ptr__,Runner2 *this,Runner *context,TestCaseFilters *filterGroup
          )

{
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_> *pvVar4;
  undefined4 extraout_var_00;
  reference pTVar5;
  ostream *poVar6;
  pair<std::_Rb_tree_const_iterator<Catch::TestCaseInfo>,_bool> pVar7;
  string local_98;
  _Base_ptr local_78;
  undefined1 local_70;
  Totals local_68;
  _Self local_48;
  _Self local_40;
  int local_34;
  const_iterator cStack_30;
  int testsRunForGroup;
  const_iterator itEnd;
  const_iterator it;
  TestCaseFilters *filterGroup_local;
  Runner *context_local;
  Runner2 *this_local;
  
  Totals::Totals(__return_storage_ptr__);
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[3])();
  pvVar4 = (vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_> *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))();
  itEnd = std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>::begin(pvVar4);
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[3])();
  pvVar4 = (vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_> *)
           (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x10))();
  cStack_30 = std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>::end(pvVar4);
  local_34 = 0;
  while (bVar1 = __gnu_cxx::operator!=(&itEnd,&stack0xffffffffffffffd0), bVar1) {
    pTVar5 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCaseInfo_*,_std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>_>
             ::operator*(&itEnd);
    bVar1 = TestCaseFilters::shouldInclude(filterGroup,pTVar5);
    if (bVar1) {
      local_34 = local_34 + 1;
      pTVar5 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCaseInfo_*,_std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>_>
               ::operator*(&itEnd);
      local_40._M_node =
           (_Base_ptr)
           std::
           set<Catch::TestCaseInfo,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
           ::find(&this->m_testsAlreadyRun,pTVar5);
      local_48._M_node =
           (_Base_ptr)
           std::
           set<Catch::TestCaseInfo,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
           ::end(&this->m_testsAlreadyRun);
      bVar1 = std::operator==(&local_40,&local_48);
      if (bVar1) {
        bVar1 = Runner::aborting(context);
        if (bVar1) break;
        pTVar5 = __gnu_cxx::
                 __normal_iterator<const_Catch::TestCaseInfo_*,_std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>_>
                 ::operator*(&itEnd);
        Runner::runTest(&local_68,context,pTVar5);
        Totals::operator+=(__return_storage_ptr__,&local_68);
        pTVar5 = __gnu_cxx::
                 __normal_iterator<const_Catch::TestCaseInfo_*,_std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>_>
                 ::operator*(&itEnd);
        pVar7 = std::
                set<Catch::TestCaseInfo,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
                ::insert(&this->m_testsAlreadyRun,pTVar5);
        local_78 = (_Base_ptr)pVar7.first._M_node;
        local_70 = pVar7.second;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseInfo_*,_std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>_>
    ::operator++(&itEnd);
  }
  if (local_34 == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"\n[No test cases matched with: ");
    TestCaseFilters::getName_abi_cxx11_(&local_98,filterGroup);
    poVar6 = std::operator<<(poVar6,(string *)&local_98);
    poVar6 = std::operator<<(poVar6,"]");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

Totals runTestsForGroup( Runner& context, const TestCaseFilters& filterGroup ) {
            Totals totals;
            std::vector<TestCaseInfo>::const_iterator it = getRegistryHub().getTestCaseRegistry().getAllTests().begin();
            std::vector<TestCaseInfo>::const_iterator itEnd = getRegistryHub().getTestCaseRegistry().getAllTests().end();
            int testsRunForGroup = 0;
            for(; it != itEnd; ++it ) {
                if( filterGroup.shouldInclude( *it ) ) {
                    testsRunForGroup++;
                    if( m_testsAlreadyRun.find( *it ) == m_testsAlreadyRun.end() ) {

                        if( context.aborting() )
                            break;

                        totals += context.runTest( *it );
                        m_testsAlreadyRun.insert( *it );
                    }
                }
            }
            if( testsRunForGroup == 0 )
                std::cerr << "\n[No test cases matched with: " << filterGroup.getName() << "]" << std::endl;
            return totals;

        }